

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O1

void __thiscall n_e_s::core::Ppu::Ppu(Ppu *this,PpuRegisters *registers,IMmu *mmu)

{
  (this->super_IPpu)._vptr_IPpu = (_func_int **)&PTR__Ppu_00134a30;
  this->registers_ = registers;
  this->mmu_ = mmu;
  *(undefined8 *)&(this->on_nmi_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->on_nmi_).super__Function_base._M_functor + 8) = 0;
  (this->on_nmi_)._M_invoker =
       std::
       _Function_handler<void_(),_n_e_s::core::Ppu::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/ppu.h:31:35)>
       ::_M_invoke;
  (this->on_nmi_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_n_e_s::core::Ppu::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/ppu.h:31:35)>
       ::_M_manager;
  memset(&this->read_buffer_,0,0x101);
  return;
}

Assistant:

Ppu::Ppu(PpuRegisters *registers, IMmu *mmu)
        : registers_(registers), mmu_(mmu) {}